

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seismogram.cpp
# Opt level: O1

void __thiscall
CombinedSeismogramm<float,_3>::AddValue
          (CombinedSeismogramm<float,_3> *this,float time,Elastic *elastic,IndexType detectorIndex)

{
  vector<float,std::allocator<float>> *this_00;
  iterator iVar1;
  pointer pSVar2;
  long lVar3;
  undefined4 in_EAX;
  pointer pCVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  float extraout_XMM0_Da;
  float local_38;
  float local_34;
  
  _local_38 = CONCAT44(time,in_EAX);
  iVar1._M_current =
       (this->times).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->times).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
              ((vector<float,std::allocator<float>> *)this,iVar1,&local_34);
  }
  else {
    *iVar1._M_current = time;
    (this->times).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  pCVar4 = (this->componentInfos).
           super__Vector_base<CombinedSeismogramm<float,_3>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_3>::ComponentInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->componentInfos).
      super__Vector_base<CombinedSeismogramm<float,_3>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_3>::ComponentInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish != pCVar4) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      pSVar2 = (this->seismogramms).
               super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      (**(pCVar4[uVar5].getter)->_vptr_ValueGetter)(pCVar4[uVar5].getter,elastic);
      _local_38 = CONCAT44(local_34,extraout_XMM0_Da);
      this_00 = (vector<float,std::allocator<float>> *)
                (*(long *)&pSVar2[uVar5].data.
                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           ._M_impl + (ulong)detectorIndex * 0x18);
      iVar1._M_current = *(float **)(this_00 + 8);
      if (iVar1._M_current == *(float **)(this_00 + 0x10)) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  (this_00,iVar1,&local_38);
      }
      else {
        *iVar1._M_current = extraout_XMM0_Da;
        *(float **)(this_00 + 8) = iVar1._M_current + 1;
      }
      pCVar4 = (this->componentInfos).
               super__Vector_base<CombinedSeismogramm<float,_3>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_3>::ComponentInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->componentInfos).
                     super__Vector_base<CombinedSeismogramm<float,_3>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_3>::ComponentInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4 >> 3) *
              -0x3333333333333333;
      bVar7 = uVar6 <= uVar5;
      lVar3 = uVar5 - uVar6;
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar7 && lVar3 != 0);
  }
  return;
}

Assistant:

void CombinedSeismogramm<Scalar, dims>::AddValue(Scalar time, const Elastic& elastic, IndexType detectorIndex)
{
    times.push_back(time);
    for (IndexType i = 0; i < componentInfos.size(); ++i)
    {
        seismogramms[i].AddValue(componentInfos[i].getter->GetValue(elastic), detectorIndex);
    }
}